

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  ulong uVar2;
  Scene *pSVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  RTCFilterFunctionN p_Var9;
  StackItemT<embree::NodeRefPtr<4>_> SVar10;
  StackItemT<embree::NodeRefPtr<4>_> SVar11;
  StackItemT<embree::NodeRefPtr<4>_> SVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar32;
  byte bVar33;
  int iVar34;
  undefined4 uVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  uint uVar40;
  ulong uVar41;
  long lVar42;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar43;
  ulong uVar44;
  float fVar45;
  float fVar53;
  float fVar54;
  vint4 bi_1;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar55;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  vint4 bi;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  vint4 ai;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [64];
  float fVar84;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  undefined1 auVar85 [64];
  uint uVar91;
  uint uVar92;
  uint uVar93;
  undefined1 auVar90 [64];
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [64];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 local_1218 [16];
  vbool<4> valid;
  Scene *scene;
  undefined1 local_11c8 [16];
  Geometry *local_11b8;
  ulong local_11b0;
  undefined1 (*local_11a8) [16];
  long local_11a0;
  RTCFilterFunctionNArguments args;
  undefined8 local_1168;
  undefined8 uStack_1160;
  vfloat<4> tNear;
  float local_10f8 [4];
  float local_10e8 [4];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined8 local_1018;
  undefined8 uStack_1010;
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar43 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  uVar35 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1028._4_4_ = uVar35;
  local_1028._0_4_ = uVar35;
  local_1028._8_4_ = uVar35;
  local_1028._12_4_ = uVar35;
  auVar83 = ZEXT1664(local_1028);
  uVar35 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_1038._4_4_ = uVar35;
  local_1038._0_4_ = uVar35;
  local_1038._8_4_ = uVar35;
  local_1038._12_4_ = uVar35;
  auVar85 = ZEXT1664(local_1038);
  uVar35 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1048._4_4_ = uVar35;
  local_1048._0_4_ = uVar35;
  local_1048._8_4_ = uVar35;
  local_1048._12_4_ = uVar35;
  auVar90 = ZEXT1664(local_1048);
  fVar45 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar53 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar54 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar39 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar44 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar34 = (tray->tfar).field_0.i[k];
  auVar52 = ZEXT1664(CONCAT412(iVar34,CONCAT48(iVar34,CONCAT44(iVar34,iVar34))));
  iVar34 = (tray->tnear).field_0.i[k];
  local_1088._4_4_ = iVar34;
  local_1088._0_4_ = iVar34;
  local_1088._8_4_ = iVar34;
  local_1088._12_4_ = iVar34;
  auVar109 = ZEXT1664(local_1088);
  local_11a8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_1058 = fVar45;
  fStack_1054 = fVar45;
  fStack_1050 = fVar45;
  fStack_104c = fVar45;
  local_1068 = fVar53;
  fStack_1064 = fVar53;
  fStack_1060 = fVar53;
  fStack_105c = fVar53;
  local_1078 = fVar54;
  fStack_1074 = fVar54;
  fStack_1070 = fVar54;
  fStack_106c = fVar54;
  fVar55 = fVar45;
  fVar89 = fVar45;
  fVar94 = fVar45;
  fVar95 = fVar53;
  fVar96 = fVar53;
  fVar97 = fVar53;
  fVar101 = fVar54;
  fVar103 = fVar54;
  fVar105 = fVar54;
LAB_00edf2ae:
  do {
    do {
      if (pSVar43 == stack) {
        return;
      }
      pSVar32 = pSVar43 + -1;
      pSVar43 = pSVar43 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < (float)pSVar32->dist);
    uVar38 = (pSVar43->ptr).ptr;
    while ((uVar38 & 8) == 0) {
      auVar57 = vsubps_avx(*(undefined1 (*) [16])(uVar38 + 0x20 + uVar41),auVar83._0_16_);
      auVar56._0_4_ = fVar45 * auVar57._0_4_;
      auVar56._4_4_ = fVar55 * auVar57._4_4_;
      auVar56._8_4_ = fVar89 * auVar57._8_4_;
      auVar56._12_4_ = fVar94 * auVar57._12_4_;
      auVar57 = vsubps_avx(*(undefined1 (*) [16])(uVar38 + 0x20 + uVar39),auVar85._0_16_);
      auVar68._0_4_ = fVar53 * auVar57._0_4_;
      auVar68._4_4_ = fVar95 * auVar57._4_4_;
      auVar68._8_4_ = fVar96 * auVar57._8_4_;
      auVar68._12_4_ = fVar97 * auVar57._12_4_;
      auVar57 = vpmaxsd_avx(auVar56,auVar68);
      auVar56 = vsubps_avx(*(undefined1 (*) [16])(uVar38 + 0x20 + uVar44),auVar90._0_16_);
      auVar69._0_4_ = fVar54 * auVar56._0_4_;
      auVar69._4_4_ = fVar101 * auVar56._4_4_;
      auVar69._8_4_ = fVar103 * auVar56._8_4_;
      auVar69._12_4_ = fVar105 * auVar56._12_4_;
      auVar56 = vpmaxsd_avx(auVar69,auVar109._0_16_);
      tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vpmaxsd_avx(auVar57,auVar56);
      auVar57 = vsubps_avx(*(undefined1 (*) [16])(uVar38 + 0x20 + (uVar41 ^ 0x10)),auVar83._0_16_);
      auVar70._0_4_ = fVar45 * auVar57._0_4_;
      auVar70._4_4_ = fVar55 * auVar57._4_4_;
      auVar70._8_4_ = fVar89 * auVar57._8_4_;
      auVar70._12_4_ = fVar94 * auVar57._12_4_;
      auVar57 = vsubps_avx(*(undefined1 (*) [16])(uVar38 + 0x20 + (uVar39 ^ 0x10)),auVar85._0_16_);
      auVar77._0_4_ = fVar53 * auVar57._0_4_;
      auVar77._4_4_ = fVar95 * auVar57._4_4_;
      auVar77._8_4_ = fVar96 * auVar57._8_4_;
      auVar77._12_4_ = fVar97 * auVar57._12_4_;
      auVar57 = vpminsd_avx(auVar70,auVar77);
      auVar56 = vsubps_avx(*(undefined1 (*) [16])(uVar38 + 0x20 + (uVar44 ^ 0x10)),auVar90._0_16_);
      auVar78._0_4_ = fVar54 * auVar56._0_4_;
      auVar78._4_4_ = fVar101 * auVar56._4_4_;
      auVar78._8_4_ = fVar103 * auVar56._8_4_;
      auVar78._12_4_ = fVar105 * auVar56._12_4_;
      auVar56 = vpminsd_avx(auVar78,auVar52._0_16_);
      auVar57 = vpminsd_avx(auVar57,auVar56);
      auVar57 = vpcmpgtd_avx((undefined1  [16])tNear.field_0,auVar57);
      iVar34 = vmovmskps_avx(auVar57);
      if (iVar34 == 0xf) goto LAB_00edf2ae;
      bVar33 = (byte)iVar34 ^ 0xf;
      uVar37 = uVar38 & 0xfffffffffffffff0;
      lVar42 = 0;
      if (bVar33 != 0) {
        for (; (bVar33 >> lVar42 & 1) == 0; lVar42 = lVar42 + 1) {
        }
      }
      uVar38 = *(ulong *)(uVar37 + lVar42 * 8);
      uVar40 = bVar33 - 1 & (uint)bVar33;
      if (uVar40 != 0) {
        uVar91 = tNear.field_0.i[lVar42];
        lVar42 = 0;
        if (uVar40 != 0) {
          for (; (uVar40 >> lVar42 & 1) == 0; lVar42 = lVar42 + 1) {
          }
        }
        uVar2 = *(ulong *)(uVar37 + lVar42 * 8);
        uVar92 = tNear.field_0.i[lVar42];
        uVar40 = uVar40 - 1 & uVar40;
        if (uVar40 == 0) {
          if (uVar91 < uVar92) {
            (pSVar43->ptr).ptr = uVar2;
            pSVar43->dist = uVar92;
            pSVar43 = pSVar43 + 1;
          }
          else {
            (pSVar43->ptr).ptr = uVar38;
            pSVar43->dist = uVar91;
            uVar38 = uVar2;
            pSVar43 = pSVar43 + 1;
          }
        }
        else {
          auVar57._8_8_ = 0;
          auVar57._0_8_ = uVar38;
          auVar57 = vpunpcklqdq_avx(auVar57,ZEXT416(uVar91));
          auVar71._8_8_ = 0;
          auVar71._0_8_ = uVar2;
          auVar56 = vpunpcklqdq_avx(auVar71,ZEXT416(uVar92));
          lVar42 = 0;
          if (uVar40 != 0) {
            for (; (uVar40 >> lVar42 & 1) == 0; lVar42 = lVar42 + 1) {
            }
          }
          auVar79._8_8_ = 0;
          auVar79._0_8_ = *(ulong *)(uVar37 + lVar42 * 8);
          auVar69 = vpunpcklqdq_avx(auVar79,ZEXT416((uint)tNear.field_0.i[lVar42]));
          auVar68 = vpcmpgtd_avx(auVar56,auVar57);
          uVar40 = uVar40 - 1 & uVar40;
          if (uVar40 == 0) {
            auVar70 = vpshufd_avx(auVar68,0xaa);
            auVar68 = vblendvps_avx(auVar56,auVar57,auVar70);
            auVar57 = vblendvps_avx(auVar57,auVar56,auVar70);
            auVar56 = vpcmpgtd_avx(auVar69,auVar68);
            auVar70 = vpshufd_avx(auVar56,0xaa);
            auVar56 = vblendvps_avx(auVar69,auVar68,auVar70);
            auVar68 = vblendvps_avx(auVar68,auVar69,auVar70);
            auVar69 = vpcmpgtd_avx(auVar68,auVar57);
            auVar69 = vpshufd_avx(auVar69,0xaa);
            SVar10 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar68,auVar57,auVar69);
            SVar11 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar57,auVar68,auVar69);
            *pSVar43 = SVar11;
            pSVar43[1] = SVar10;
            uVar38 = auVar56._0_8_;
            pSVar43 = pSVar43 + 2;
          }
          else {
            lVar42 = 0;
            if (uVar40 != 0) {
              for (; (uVar40 >> lVar42 & 1) == 0; lVar42 = lVar42 + 1) {
              }
            }
            auVar81._8_8_ = 0;
            auVar81._0_8_ = *(ulong *)(uVar37 + lVar42 * 8);
            auVar77 = vpunpcklqdq_avx(auVar81,ZEXT416((uint)tNear.field_0.i[lVar42]));
            auVar70 = vpshufd_avx(auVar68,0xaa);
            auVar68 = vblendvps_avx(auVar56,auVar57,auVar70);
            auVar57 = vblendvps_avx(auVar57,auVar56,auVar70);
            auVar56 = vpcmpgtd_avx(auVar77,auVar69);
            auVar70 = vpshufd_avx(auVar56,0xaa);
            auVar56 = vblendvps_avx(auVar77,auVar69,auVar70);
            auVar69 = vblendvps_avx(auVar69,auVar77,auVar70);
            auVar70 = vpcmpgtd_avx(auVar69,auVar57);
            auVar77 = vpshufd_avx(auVar70,0xaa);
            auVar70 = vblendvps_avx(auVar69,auVar57,auVar77);
            SVar10 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar57,auVar69,auVar77);
            auVar57 = vpcmpgtd_avx(auVar56,auVar68);
            auVar69 = vpshufd_avx(auVar57,0xaa);
            auVar57 = vblendvps_avx(auVar56,auVar68,auVar69);
            auVar56 = vblendvps_avx(auVar68,auVar56,auVar69);
            auVar68 = vpcmpgtd_avx(auVar70,auVar56);
            auVar68 = vpshufd_avx(auVar68,0xaa);
            SVar11 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar70,auVar56,auVar68);
            SVar12 = (StackItemT<embree::NodeRefPtr<4>_>)vblendvps_avx(auVar56,auVar70,auVar68);
            *pSVar43 = SVar10;
            pSVar43[1] = SVar12;
            pSVar43[2] = SVar11;
            uVar38 = auVar57._0_8_;
            pSVar43 = pSVar43 + 3;
          }
        }
      }
    }
    local_11a0 = (ulong)((uint)uVar38 & 0xf) - 8;
    uVar38 = uVar38 & 0xfffffffffffffff0;
    for (lVar42 = 0; lVar42 != local_11a0; lVar42 = lVar42 + 1) {
      lVar36 = lVar42 * 0x50;
      pSVar3 = context->scene;
      ppfVar4 = (pSVar3->vertices).items;
      pfVar5 = ppfVar4[*(uint *)(uVar38 + 0x30 + lVar36)];
      pfVar6 = ppfVar4[*(uint *)(uVar38 + 0x34 + lVar36)];
      pfVar7 = ppfVar4[*(uint *)(uVar38 + 0x38 + lVar36)];
      pfVar8 = ppfVar4[*(uint *)(uVar38 + 0x3c + lVar36)];
      auVar68 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar38 + lVar36)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar38 + 8 + lVar36)));
      auVar57 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar38 + lVar36)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar38 + 8 + lVar36)));
      auVar69 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar38 + 4 + lVar36)),
                              *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar38 + 0xc + lVar36)));
      auVar56 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar38 + 4 + lVar36)),
                              *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar38 + 0xc + lVar36)));
      auVar71 = vunpcklps_avx(auVar57,auVar56);
      auVar79 = vunpcklps_avx(auVar68,auVar69);
      auVar78 = vunpckhps_avx(auVar68,auVar69);
      auVar68 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar38 + 0x10 + lVar36)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar38 + 0x18 + lVar36)));
      auVar57 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar38 + 0x10 + lVar36)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar38 + 0x18 + lVar36)));
      auVar69 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar38 + 0x14 + lVar36)),
                              *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar38 + 0x1c + lVar36)));
      auVar56 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar38 + 0x14 + lVar36)),
                              *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar38 + 0x1c + lVar36)));
      auVar77 = vunpcklps_avx(auVar57,auVar56);
      auVar81 = vunpcklps_avx(auVar68,auVar69);
      auVar56 = vunpckhps_avx(auVar68,auVar69);
      auVar69 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar38 + 0x20 + lVar36)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar38 + 0x28 + lVar36)));
      auVar57 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar38 + 0x20 + lVar36)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar38 + 0x28 + lVar36)));
      auVar70 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar38 + 0x24 + lVar36)),
                              *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar38 + 0x2c + lVar36)));
      auVar68 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar38 + 0x24 + lVar36)),
                              *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar38 + 0x2c + lVar36)));
      auVar46 = vunpcklps_avx(auVar57,auVar68);
      auVar47 = vunpcklps_avx(auVar69,auVar70);
      auVar70 = vunpckhps_avx(auVar69,auVar70);
      puVar1 = (undefined8 *)(uVar38 + 0x30 + lVar36);
      local_1018 = *puVar1;
      uStack_1010 = puVar1[1];
      puVar1 = (undefined8 *)(uVar38 + 0x40 + lVar36);
      local_1168 = *puVar1;
      uStack_1160 = puVar1[1];
      auVar57 = vsubps_avx(auVar79,auVar81);
      auVar56 = vsubps_avx(auVar78,auVar56);
      auVar68 = vsubps_avx(auVar71,auVar77);
      auVar69 = vsubps_avx(auVar47,auVar79);
      auVar70 = vsubps_avx(auVar70,auVar78);
      auVar77 = vsubps_avx(auVar46,auVar71);
      fVar55 = auVar77._0_4_;
      fVar98 = auVar56._0_4_;
      auVar46._0_4_ = fVar98 * fVar55;
      fVar103 = auVar77._4_4_;
      fVar102 = auVar56._4_4_;
      auVar46._4_4_ = fVar102 * fVar103;
      fVar18 = auVar77._8_4_;
      fVar104 = auVar56._8_4_;
      auVar46._8_4_ = fVar104 * fVar18;
      fVar25 = auVar77._12_4_;
      fVar106 = auVar56._12_4_;
      auVar46._12_4_ = fVar106 * fVar25;
      fVar89 = auVar70._0_4_;
      fVar84 = auVar68._0_4_;
      auVar58._0_4_ = fVar84 * fVar89;
      fVar105 = auVar70._4_4_;
      fVar86 = auVar68._4_4_;
      auVar58._4_4_ = fVar86 * fVar105;
      fVar19 = auVar70._8_4_;
      fVar87 = auVar68._8_4_;
      auVar58._8_4_ = fVar87 * fVar19;
      fVar26 = auVar70._12_4_;
      fVar88 = auVar68._12_4_;
      auVar58._12_4_ = fVar88 * fVar26;
      local_10c8 = vsubps_avx(auVar58,auVar46);
      fVar94 = auVar69._0_4_;
      auVar59._0_4_ = fVar84 * fVar94;
      fVar13 = auVar69._4_4_;
      auVar59._4_4_ = fVar86 * fVar13;
      fVar20 = auVar69._8_4_;
      auVar59._8_4_ = fVar87 * fVar20;
      fVar27 = auVar69._12_4_;
      auVar59._12_4_ = fVar88 * fVar27;
      fVar95 = auVar57._0_4_;
      auVar72._0_4_ = fVar55 * fVar95;
      fVar14 = auVar57._4_4_;
      auVar72._4_4_ = fVar103 * fVar14;
      fVar21 = auVar57._8_4_;
      auVar72._8_4_ = fVar18 * fVar21;
      fVar28 = auVar57._12_4_;
      auVar72._12_4_ = fVar25 * fVar28;
      local_10b8 = vsubps_avx(auVar72,auVar59);
      auVar73._0_4_ = fVar89 * fVar95;
      auVar73._4_4_ = fVar105 * fVar14;
      auVar73._8_4_ = fVar19 * fVar21;
      auVar73._12_4_ = fVar26 * fVar28;
      auVar99._0_4_ = fVar98 * fVar94;
      auVar99._4_4_ = fVar102 * fVar13;
      auVar99._8_4_ = fVar104 * fVar20;
      auVar99._12_4_ = fVar106 * fVar27;
      auVar69 = vsubps_avx(auVar99,auVar73);
      uVar35 = *(undefined4 *)(ray + k * 4);
      auVar100._4_4_ = uVar35;
      auVar100._0_4_ = uVar35;
      auVar100._8_4_ = uVar35;
      auVar100._12_4_ = uVar35;
      uVar35 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar107._4_4_ = uVar35;
      auVar107._0_4_ = uVar35;
      auVar107._8_4_ = uVar35;
      auVar107._12_4_ = uVar35;
      uVar35 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar110._4_4_ = uVar35;
      auVar110._0_4_ = uVar35;
      auVar110._8_4_ = uVar35;
      auVar110._12_4_ = uVar35;
      fVar45 = *(float *)(ray + k * 4 + 0x50);
      auVar57 = vsubps_avx(auVar79,auVar100);
      fVar53 = *(float *)(ray + k * 4 + 0x60);
      auVar56 = vsubps_avx(auVar78,auVar107);
      auVar68 = vsubps_avx(auVar71,auVar110);
      fVar96 = auVar68._0_4_;
      auVar108._0_4_ = fVar45 * fVar96;
      fVar15 = auVar68._4_4_;
      auVar108._4_4_ = fVar45 * fVar15;
      fVar22 = auVar68._8_4_;
      auVar108._8_4_ = fVar45 * fVar22;
      fVar29 = auVar68._12_4_;
      auVar108._12_4_ = fVar45 * fVar29;
      fVar97 = auVar56._0_4_;
      auVar111._0_4_ = fVar53 * fVar97;
      fVar16 = auVar56._4_4_;
      auVar111._4_4_ = fVar53 * fVar16;
      fVar23 = auVar56._8_4_;
      auVar111._8_4_ = fVar53 * fVar23;
      fVar30 = auVar56._12_4_;
      auVar111._12_4_ = fVar53 * fVar30;
      auVar56 = vsubps_avx(auVar111,auVar108);
      fVar54 = *(float *)(ray + k * 4 + 0x40);
      fVar101 = auVar57._0_4_;
      auVar47._0_4_ = fVar53 * fVar101;
      fVar17 = auVar57._4_4_;
      auVar47._4_4_ = fVar53 * fVar17;
      fVar24 = auVar57._8_4_;
      auVar47._8_4_ = fVar53 * fVar24;
      fVar31 = auVar57._12_4_;
      auVar47._12_4_ = fVar53 * fVar31;
      auVar60._0_4_ = fVar54 * fVar96;
      auVar60._4_4_ = fVar54 * fVar15;
      auVar60._8_4_ = fVar54 * fVar22;
      auVar60._12_4_ = fVar54 * fVar29;
      auVar68 = vsubps_avx(auVar60,auVar47);
      auVar61._0_4_ = fVar54 * fVar97;
      auVar61._4_4_ = fVar54 * fVar16;
      auVar61._8_4_ = fVar54 * fVar23;
      auVar61._12_4_ = fVar54 * fVar30;
      auVar74._0_4_ = fVar45 * fVar101;
      auVar74._4_4_ = fVar45 * fVar17;
      auVar74._8_4_ = fVar45 * fVar24;
      auVar74._12_4_ = fVar45 * fVar31;
      auVar70 = vsubps_avx(auVar74,auVar61);
      auVar75._0_4_ = fVar54 * local_10c8._0_4_ + fVar45 * local_10b8._0_4_ + fVar53 * auVar69._0_4_
      ;
      auVar75._4_4_ = fVar54 * local_10c8._4_4_ + fVar45 * local_10b8._4_4_ + fVar53 * auVar69._4_4_
      ;
      auVar75._8_4_ = fVar54 * local_10c8._8_4_ + fVar45 * local_10b8._8_4_ + fVar53 * auVar69._8_4_
      ;
      auVar75._12_4_ =
           fVar54 * local_10c8._12_4_ + fVar45 * local_10b8._12_4_ + fVar53 * auVar69._12_4_;
      auVar62._8_4_ = 0x80000000;
      auVar62._0_8_ = 0x8000000080000000;
      auVar62._12_4_ = 0x80000000;
      auVar57 = vandps_avx(auVar75,auVar62);
      uVar40 = auVar57._0_4_;
      tNear.field_0._0_4_ =
           (float)(uVar40 ^ (uint)(fVar94 * auVar56._0_4_ +
                                  fVar55 * auVar70._0_4_ + fVar89 * auVar68._0_4_));
      uVar91 = auVar57._4_4_;
      tNear.field_0._4_4_ =
           (float)(uVar91 ^ (uint)(fVar13 * auVar56._4_4_ +
                                  fVar103 * auVar70._4_4_ + fVar105 * auVar68._4_4_));
      uVar92 = auVar57._8_4_;
      tNear.field_0._8_4_ =
           (float)(uVar92 ^ (uint)(fVar20 * auVar56._8_4_ +
                                  fVar18 * auVar70._8_4_ + fVar19 * auVar68._8_4_));
      uVar93 = auVar57._12_4_;
      tNear.field_0._12_4_ =
           (float)(uVar93 ^ (uint)(fVar27 * auVar56._12_4_ +
                                  fVar25 * auVar70._12_4_ + fVar26 * auVar68._12_4_));
      auVar80._0_4_ =
           (float)(uVar40 ^ (uint)(auVar56._0_4_ * fVar95 +
                                  fVar84 * auVar70._0_4_ + auVar68._0_4_ * fVar98));
      auVar80._4_4_ =
           (float)(uVar91 ^ (uint)(auVar56._4_4_ * fVar14 +
                                  fVar86 * auVar70._4_4_ + auVar68._4_4_ * fVar102));
      auVar80._8_4_ =
           (float)(uVar92 ^ (uint)(auVar56._8_4_ * fVar21 +
                                  fVar87 * auVar70._8_4_ + auVar68._8_4_ * fVar104));
      auVar80._12_4_ =
           (float)(uVar93 ^ (uint)(auVar56._12_4_ * fVar28 +
                                  fVar88 * auVar70._12_4_ + auVar68._12_4_ * fVar106));
      auVar68 = ZEXT416(0) << 0x20;
      auVar57 = vcmpps_avx((undefined1  [16])tNear.field_0,auVar68,5);
      auVar56 = vcmpps_avx(auVar80,auVar68,5);
      auVar57 = vandps_avx(auVar57,auVar56);
      auVar63._8_4_ = 0x7fffffff;
      auVar63._0_8_ = 0x7fffffff7fffffff;
      auVar63._12_4_ = 0x7fffffff;
      auVar56 = vandps_avx(auVar75,auVar63);
      auVar68 = vcmpps_avx(auVar68,auVar75,4);
      auVar57 = vandps_avx(auVar57,auVar68);
      auVar48._0_4_ = tNear.field_0._0_4_ + auVar80._0_4_;
      auVar48._4_4_ = tNear.field_0._4_4_ + auVar80._4_4_;
      auVar48._8_4_ = tNear.field_0._8_4_ + auVar80._8_4_;
      auVar48._12_4_ = tNear.field_0._12_4_ + auVar80._12_4_;
      auVar68 = vcmpps_avx(auVar48,auVar56,2);
      auVar70 = auVar68 & auVar57;
      if ((((auVar70 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar70 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar70 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar70[0xf] < '\0'
         ) {
        auVar57 = vandps_avx(auVar57,auVar68);
        auVar82._0_4_ =
             (float)(uVar40 ^ (uint)(local_10c8._0_4_ * fVar101 +
                                    local_10b8._0_4_ * fVar97 + fVar96 * auVar69._0_4_));
        auVar82._4_4_ =
             (float)(uVar91 ^ (uint)(local_10c8._4_4_ * fVar17 +
                                    local_10b8._4_4_ * fVar16 + fVar15 * auVar69._4_4_));
        auVar82._8_4_ =
             (float)(uVar92 ^ (uint)(local_10c8._8_4_ * fVar24 +
                                    local_10b8._8_4_ * fVar23 + fVar22 * auVar69._8_4_));
        auVar82._12_4_ =
             (float)(uVar93 ^ (uint)(local_10c8._12_4_ * fVar31 +
                                    local_10b8._12_4_ * fVar30 + fVar29 * auVar69._12_4_));
        fVar45 = *(float *)(ray + k * 4 + 0x30);
        fVar53 = auVar56._0_4_;
        auVar49._0_4_ = fVar53 * fVar45;
        fVar54 = auVar56._4_4_;
        auVar49._4_4_ = fVar54 * fVar45;
        fVar55 = auVar56._8_4_;
        auVar49._8_4_ = fVar55 * fVar45;
        fVar89 = auVar56._12_4_;
        auVar49._12_4_ = fVar89 * fVar45;
        auVar68 = vcmpps_avx(auVar49,auVar82,1);
        fVar45 = *(float *)(ray + k * 4 + 0x80);
        auVar52 = ZEXT1664(CONCAT412(fVar45,CONCAT48(fVar45,CONCAT44(fVar45,fVar45))));
        auVar64._0_4_ = fVar53 * fVar45;
        auVar64._4_4_ = fVar54 * fVar45;
        auVar64._8_4_ = fVar55 * fVar45;
        auVar64._12_4_ = fVar89 * fVar45;
        auVar70 = vcmpps_avx(auVar82,auVar64,2);
        auVar68 = vandps_avx(auVar68,auVar70);
        auVar70 = auVar57 & auVar68;
        if ((((auVar70 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar70 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar70 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar70[0xf] < '\0') {
          valid.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)vandps_avx(auVar57,auVar68)
          ;
          local_1218._0_8_ = auVar69._0_8_;
          local_1218._8_8_ = auVar69._8_8_;
          local_10a8 = local_1218._0_8_;
          uStack_10a0 = local_1218._8_8_;
          auVar57 = vrcpps_avx(auVar56);
          fVar45 = auVar57._0_4_;
          auVar65._0_4_ = fVar53 * fVar45;
          fVar53 = auVar57._4_4_;
          auVar65._4_4_ = fVar54 * fVar53;
          fVar54 = auVar57._8_4_;
          auVar65._8_4_ = fVar55 * fVar54;
          fVar55 = auVar57._12_4_;
          auVar65._12_4_ = fVar89 * fVar55;
          auVar76._8_4_ = 0x3f800000;
          auVar76._0_8_ = 0x3f8000003f800000;
          auVar76._12_4_ = 0x3f800000;
          auVar57 = vsubps_avx(auVar76,auVar65);
          fVar45 = fVar45 + fVar45 * auVar57._0_4_;
          fVar53 = fVar53 + fVar53 * auVar57._4_4_;
          fVar54 = fVar54 + fVar54 * auVar57._8_4_;
          fVar55 = fVar55 + fVar55 * auVar57._12_4_;
          local_10d8._0_4_ = fVar45 * auVar82._0_4_;
          local_10d8._4_4_ = fVar53 * auVar82._4_4_;
          local_10d8._8_4_ = fVar54 * auVar82._8_4_;
          local_10d8._12_4_ = fVar55 * auVar82._12_4_;
          auVar83 = ZEXT1664(local_10d8);
          local_10f8[0] = fVar45 * tNear.field_0._0_4_;
          local_10f8[1] = fVar53 * tNear.field_0._4_4_;
          local_10f8[2] = fVar54 * tNear.field_0._8_4_;
          local_10f8[3] = fVar55 * tNear.field_0._12_4_;
          auVar66._8_4_ = 0x7f800000;
          auVar66._0_8_ = 0x7f8000007f800000;
          auVar66._12_4_ = 0x7f800000;
          auVar57 = vblendvps_avx(auVar66,local_10d8,(undefined1  [16])valid.field_0);
          local_10e8[0] = fVar45 * auVar80._0_4_;
          local_10e8[1] = fVar53 * auVar80._4_4_;
          local_10e8[2] = fVar54 * auVar80._8_4_;
          local_10e8[3] = fVar55 * auVar80._12_4_;
          auVar56 = vshufps_avx(auVar57,auVar57,0xb1);
          auVar56 = vminps_avx(auVar56,auVar57);
          auVar68 = vshufpd_avx(auVar56,auVar56,1);
          auVar56 = vminps_avx(auVar68,auVar56);
          auVar57 = vcmpps_avx(auVar57,auVar56,0);
          auVar68 = (undefined1  [16])valid.field_0 & auVar57;
          auVar56 = vpcmpeqd_avx(auVar56,auVar56);
          if ((((auVar68 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar68 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar68 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar68[0xf] < '\0') {
            auVar56 = auVar57;
          }
          auVar57 = vandps_avx((undefined1  [16])valid.field_0,auVar56);
          uVar35 = vmovmskps_avx(auVar57);
          uVar37 = CONCAT44((int)((ulong)ray >> 0x20),uVar35);
          local_11b0 = 0;
          if (uVar37 != 0) {
            for (; (uVar37 >> local_11b0 & 1) == 0; local_11b0 = local_11b0 + 1) {
            }
          }
LAB_00edf974:
          uVar40 = *(uint *)((long)&local_1018 + local_11b0 * 4);
          uVar37 = (ulong)uVar40;
          local_11b8 = (pSVar3->geometries).items[uVar37].ptr;
          if ((local_11b8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            valid.field_0.v[local_11b0] = 0.0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (local_11b8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar45 = local_10f8[local_11b0];
              fVar53 = local_10e8[local_11b0];
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_10d8 + local_11b0 * 4);
              *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_10c8 + local_11b0 * 4);
              *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_10b8 + local_11b0 * 4);
              *(undefined4 *)(ray + k * 4 + 0xe0) =
                   *(undefined4 *)((long)&local_10a8 + local_11b0 * 4);
              *(float *)(ray + k * 4 + 0xf0) = fVar45;
              *(float *)(ray + k * 4 + 0x100) = fVar53;
              *(undefined4 *)(ray + k * 4 + 0x110) =
                   *(undefined4 *)((long)&local_1168 + local_11b0 * 4);
              *(uint *)(ray + k * 4 + 0x120) = uVar40;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              goto LAB_00edf7e5;
            }
            local_1098 = auVar83._0_16_;
            fVar45 = local_10f8[local_11b0];
            h.u.field_0.i[1] = (int)fVar45;
            h.u.field_0.i[0] = (int)fVar45;
            h.u.field_0.i[2] = (int)fVar45;
            h.u.field_0.i[3] = (int)fVar45;
            h.v.field_0.v[0] = local_10e8[local_11b0];
            h.geomID.field_0 =
                 (anon_union_16_2_9473010e_for_vuint_impl<4>_1)vpshufd_avx(ZEXT416(uVar40),0);
            uVar35 = *(undefined4 *)((long)&local_1168 + local_11b0 * 4);
            h.primID.field_0.i[1] = uVar35;
            h.primID.field_0.i[0] = uVar35;
            h.primID.field_0.i[2] = uVar35;
            h.primID.field_0.i[3] = uVar35;
            uVar35 = *(undefined4 *)(local_10c8 + local_11b0 * 4);
            h.Ng.field_0._4_4_ = uVar35;
            h.Ng.field_0._0_4_ = uVar35;
            h.Ng.field_0._8_4_ = uVar35;
            h.Ng.field_0._12_4_ = uVar35;
            uVar35 = *(undefined4 *)(local_10b8 + local_11b0 * 4);
            h.Ng.field_0._20_4_ = uVar35;
            h.Ng.field_0._16_4_ = uVar35;
            h.Ng.field_0._24_4_ = uVar35;
            h.Ng.field_0._28_4_ = uVar35;
            h.Ng.field_0._32_4_ = *(undefined4 *)((long)&local_10a8 + local_11b0 * 4);
            h.Ng.field_0._36_4_ = h.Ng.field_0._32_4_;
            h.Ng.field_0._40_4_ = h.Ng.field_0._32_4_;
            h.Ng.field_0._44_4_ = h.Ng.field_0._32_4_;
            h.v.field_0.v[1] = h.v.field_0.v[0];
            h.v.field_0.v[2] = h.v.field_0.v[0];
            h.v.field_0.v[3] = h.v.field_0.v[0];
            vcmpps_avx(ZEXT1632((undefined1  [16])h.u.field_0),
                       ZEXT1632((undefined1  [16])h.u.field_0),0xf);
            h.instID[0].field_0.i[1] = context->user->instID[0];
            h.instID[0].field_0.i[0] = h.instID[0].field_0.i[1];
            h.instID[0].field_0.i[2] = h.instID[0].field_0.i[1];
            h.instID[0].field_0.i[3] = h.instID[0].field_0.i[1];
            h.instPrimID[0].field_0.i[0] = context->user->instPrimID[0];
            h.instPrimID[0].field_0.i[1] = h.instPrimID[0].field_0.i[0];
            h.instPrimID[0].field_0.i[2] = h.instPrimID[0].field_0.i[0];
            h.instPrimID[0].field_0.i[3] = h.instPrimID[0].field_0.i[0];
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_10d8 + local_11b0 * 4);
            local_11c8 = *local_11a8;
            args.valid = (int *)local_11c8;
            args.geometryUserPtr = local_11b8->userPtr;
            args.context = context->user;
            args.hit = (RTCHitN *)&h;
            args.N = 4;
            args.ray = (RTCRayN *)ray;
            if (local_11b8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              (*local_11b8->intersectionFilterN)(&args);
            }
            if (local_11c8 == (undefined1  [16])0x0) {
              auVar57 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
              auVar57 = auVar57 ^ _DAT_01f46b70;
            }
            else {
              p_Var9 = context->args->filter;
              if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((local_11b8->field_8).field_0x2 & 0x40) != 0))
                 )) {
                (*p_Var9)(&args);
              }
              auVar56 = vpcmpeqd_avx(local_11c8,_DAT_01f45a50);
              auVar57 = auVar56 ^ _DAT_01f46b70;
              if (local_11c8 != (undefined1  [16])0x0) {
                auVar56 = auVar56 ^ _DAT_01f46b70;
                auVar68 = vmaskmovps_avx(auVar56,*(undefined1 (*) [16])args.hit);
                *(undefined1 (*) [16])(args.ray + 0xc0) = auVar68;
                auVar68 = vmaskmovps_avx(auVar56,*(undefined1 (*) [16])(args.hit + 0x10));
                *(undefined1 (*) [16])(args.ray + 0xd0) = auVar68;
                auVar68 = vmaskmovps_avx(auVar56,*(undefined1 (*) [16])(args.hit + 0x20));
                *(undefined1 (*) [16])(args.ray + 0xe0) = auVar68;
                auVar68 = vmaskmovps_avx(auVar56,*(undefined1 (*) [16])(args.hit + 0x30));
                *(undefined1 (*) [16])(args.ray + 0xf0) = auVar68;
                auVar68 = vmaskmovps_avx(auVar56,*(undefined1 (*) [16])(args.hit + 0x40));
                *(undefined1 (*) [16])(args.ray + 0x100) = auVar68;
                auVar68 = vmaskmovps_avx(auVar56,*(undefined1 (*) [16])(args.hit + 0x50));
                *(undefined1 (*) [16])(args.ray + 0x110) = auVar68;
                auVar68 = vmaskmovps_avx(auVar56,*(undefined1 (*) [16])(args.hit + 0x60));
                *(undefined1 (*) [16])(args.ray + 0x120) = auVar68;
                auVar68 = vmaskmovps_avx(auVar56,*(undefined1 (*) [16])(args.hit + 0x70));
                *(undefined1 (*) [16])(args.ray + 0x130) = auVar68;
                auVar56 = vmaskmovps_avx(auVar56,*(undefined1 (*) [16])(args.hit + 0x80));
                *(undefined1 (*) [16])(args.ray + 0x140) = auVar56;
              }
            }
            auVar51._8_8_ = 0x100000001;
            auVar51._0_8_ = 0x100000001;
            if ((auVar51 & auVar57) == (undefined1  [16])0x0) {
              local_1218._0_4_ = auVar52._0_4_;
              *(undefined4 *)(ray + k * 4 + 0x80) = local_1218._0_4_;
              local_1218 = auVar52._0_16_;
            }
            else {
              local_1218 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
            }
            valid.field_0.v[local_11b0] = 0.0;
            auVar52 = ZEXT1664(local_1218);
            auVar57 = vshufps_avx(local_1218,local_1218,0);
            auVar83 = ZEXT1664(local_1098);
            auVar57 = vcmpps_avx(local_1098,auVar57,2);
            valid.field_0 =
                 (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                 vandps_avx(auVar57,(undefined1  [16])valid.field_0);
            uVar37 = local_11b0;
          }
          if (((((undefined1  [16])valid.field_0 >> 0x1f & (undefined1  [16])0x1) ==
                (undefined1  [16])0x0 &&
               ((undefined1  [16])valid.field_0 >> 0x3f & (undefined1  [16])0x1) ==
               (undefined1  [16])0x0) &&
              ((undefined1  [16])valid.field_0 >> 0x5f & (undefined1  [16])0x1) ==
              (undefined1  [16])0x0) && -1 < valid.field_0._15_1_) goto LAB_00edf7e5;
          auVar67._8_4_ = 0x7f800000;
          auVar67._0_8_ = 0x7f8000007f800000;
          auVar67._12_4_ = 0x7f800000;
          auVar57 = vblendvps_avx(auVar67,auVar83._0_16_,(undefined1  [16])valid.field_0);
          auVar56 = vshufps_avx(auVar57,auVar57,0xb1);
          auVar56 = vminps_avx(auVar56,auVar57);
          auVar68 = vshufpd_avx(auVar56,auVar56,1);
          auVar56 = vminps_avx(auVar68,auVar56);
          auVar57 = vcmpps_avx(auVar57,auVar56,0);
          auVar56 = (undefined1  [16])valid.field_0 & auVar57;
          aVar50 = valid.field_0;
          if ((((auVar56 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar56 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar56 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar56[0xf] < '\0') {
            aVar50.v = (__m128)vandps_avx(auVar57,valid.field_0);
          }
          uVar35 = vmovmskps_avx((undefined1  [16])aVar50);
          uVar37 = CONCAT44((int)(uVar37 >> 0x20),uVar35);
          local_11b0 = 0;
          if (uVar37 != 0) {
            for (; (uVar37 >> local_11b0 & 1) == 0; local_11b0 = local_11b0 + 1) {
            }
          }
          goto LAB_00edf974;
        }
      }
LAB_00edf7e5:
      auVar83 = ZEXT1664(local_1028);
      auVar85 = ZEXT1664(local_1038);
      auVar90 = ZEXT1664(local_1048);
      auVar109 = ZEXT1664(local_1088);
      fVar45 = local_1058;
      fVar55 = fStack_1054;
      fVar89 = fStack_1050;
      fVar94 = fStack_104c;
      fVar53 = local_1068;
      fVar95 = fStack_1064;
      fVar96 = fStack_1060;
      fVar97 = fStack_105c;
      fVar54 = local_1078;
      fVar101 = fStack_1074;
      fVar103 = fStack_1070;
      fVar105 = fStack_106c;
    }
    uVar35 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar52 = ZEXT1664(CONCAT412(uVar35,CONCAT48(uVar35,CONCAT44(uVar35,uVar35))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }